

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiceDriver.cpp
# Opt level: O1

int main(void)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  int iVar4;
  char *pcVar5;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[34m",5);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"--------------------------------------------------------",0x38);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"------------- Running tests for Dice class -------------",0x38);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"--------------------------------------------------------",0x38);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[30m",5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Testing ",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Dice",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"constructor",0xb);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"() method: ",0xb);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[32mPass",9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[30m",5);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Testing ",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Dice",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"roll",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"() method: ",0xb);
  bVar1 = true;
  iVar4 = 99;
  do {
    iVar2 = Dice::roll();
    bVar1 = (bool)(bVar1 & iVar2 - 1U < 6);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  pcVar5 = "\x1b[31mFail";
  pcVar3 = "\x1b[31mFail";
  if (bVar1) {
    pcVar3 = "\x1b[32mPass";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[30m",5);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[34m",5);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"--------------------------------------------------------",0x38);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"---------- Running tests for DiceRoller class ----------",0x38);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"--------------------------------------------------------",0x38);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[30m",5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Testing ",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"DiceRoller",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"constructor",0xb);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"() method: ",0xb);
  bVar1 = test_DiceRoller();
  pcVar3 = "\x1b[31mFail";
  if (bVar1) {
    pcVar3 = "\x1b[32mPass";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[30m",5);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Testing ",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"DiceRoller",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"roll",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"() method: ",0xb);
  bVar1 = test_DiceRoller_roll();
  pcVar3 = "\x1b[31mFail";
  if (bVar1) {
    pcVar3 = "\x1b[32mPass";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[30m",5);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Testing ",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"DiceRoller",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"getHistory",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"() method: ",0xb);
  bVar1 = test_DiceRoller_getHistory();
  pcVar3 = "\x1b[31mFail";
  if (bVar1) {
    pcVar3 = "\x1b[32mPass";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[30m",5);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Testing ",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"DiceRoller",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"getDiceRoller",0xd);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"() method: ",0xb);
  bVar1 = test_DiceRoller_getDiceRolled();
  pcVar3 = "\x1b[31mFail";
  if (bVar1) {
    pcVar3 = "\x1b[32mPass";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[30m",5);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Testing ",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"DiceRoller",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"getPercentages",0xe);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"() method: ",0xb);
  bVar1 = test_DiceRoller_getPercentages();
  if (bVar1) {
    pcVar5 = "\x1b[32mPass";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[30m",5);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  return 0;
}

Assistant:

int main() {
    std::cout << "\033[34m";
    std::cout << "--------------------------------------------------------" << std::endl;
    std::cout << "------------- Running tests for Dice class -------------" << std::endl;
    std::cout << "--------------------------------------------------------" << std::endl;
    std::cout << "\033[30m";

    std::cout << assert("Dice", "constructor", test_Dice());
    std::cout << assert("Dice", "roll", test_Dice_roll());

    std::cout << "\033[34m" << std::endl;
    std::cout << "--------------------------------------------------------" << std::endl;
    std::cout << "---------- Running tests for DiceRoller class ----------" << std::endl;
    std::cout << "--------------------------------------------------------" << std::endl;
    std::cout << "\033[30m";

    std::cout << assert("DiceRoller", "constructor", test_DiceRoller());
    std::cout << assert("DiceRoller", "roll", test_DiceRoller_roll());
    std::cout << assert("DiceRoller", "getHistory", test_DiceRoller_getHistory());
    std::cout << assert("DiceRoller", "getDiceRoller", test_DiceRoller_getDiceRolled());
    std::cout << assert("DiceRoller", "getPercentages", test_DiceRoller_getPercentages());

    return 0;
}